

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test::
TestBody(SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test *this)

{
  bool bVar1;
  string *psVar2;
  undefined8 *puVar3;
  AssertionResult gtest_ar;
  SubjectFactory subject_factory;
  long *local_128 [2];
  long local_118 [2];
  AssertHelper local_108 [2];
  undefined1 local_f8 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined8 local_50;
  SubjectFactory local_48 [8];
  string local_40 [24];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_48,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_50 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"EURGBP","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(local_40);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"EUR","");
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar2);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CSFX","");
  puVar3 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(psVar2);
  (**(code **)*puVar3)(&local_68,puVar3);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  if (local_108[0].data_ != (AssertHelperData *)local_f8) {
    operator_delete(local_108[0].data_,local_f8._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)__cxa_throw;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  testing::Message::Message((Message *)&local_e8);
  testing::internal::AssertHelper::AssertHelper
            (local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
             ,0x6b,"Failed");
  testing::internal::AssertHelper::operator=(local_108,(Message *)&local_e8);
  testing::internal::AssertHelper::~AssertHelper(local_108);
  if (((local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_e8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_e8.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_missing_Quantity)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "subject is incomplete, missing: Quantity");
        return;
    }

    FAIL();
}